

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.h
# Opt level: O3

size_t __thiscall
xmrig::Threads<xmrig::CudaThreads>::move
          (Threads<xmrig::CudaThreads> *this,char *profile,CudaThreads *threads)

{
  pointer pCVar1;
  pointer pCVar2;
  const_iterator cVar3;
  size_t sVar4;
  pair<const_xmrig::String,_xmrig::CudaThreads> local_50;
  
  String::String(&local_50.first,"cn/blur");
  cVar3 = std::
          _Rb_tree<xmrig::String,_std::pair<const_xmrig::String,_xmrig::CudaThreads>,_std::_Select1st<std::pair<const_xmrig::String,_xmrig::CudaThreads>_>,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CudaThreads>_>_>
          ::find((_Rb_tree<xmrig::String,_std::pair<const_xmrig::String,_xmrig::CudaThreads>,_std::_Select1st<std::pair<const_xmrig::String,_xmrig::CudaThreads>_>,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CudaThreads>_>_>
                  *)this,&local_50.first);
  if (local_50.first.m_data != (char *)0x0) {
    operator_delete__(local_50.first.m_data);
  }
  if ((_Rb_tree_header *)cVar3._M_node == &(this->m_profiles)._M_t._M_impl.super__Rb_tree_header) {
    pCVar1 = (threads->m_data).
             super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar2 = (threads->m_data).
             super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = (long)pCVar1 - (long)pCVar2 >> 5;
    if (pCVar1 != pCVar2) {
      String::String(&local_50.first,profile);
      local_50.second.m_data.
      super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
      super__Vector_impl_data._M_start =
           (threads->m_data).
           super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_50.second.m_data.
      super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (threads->m_data).
           super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_50.second.m_data.
      super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (threads->m_data).
           super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (threads->m_data).super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (threads->m_data).super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (threads->m_data).super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      _Rb_tree<xmrig::String,std::pair<xmrig::String_const,xmrig::CudaThreads>,std::_Select1st<std::pair<xmrig::String_const,xmrig::CudaThreads>>,std::less<xmrig::String>,std::allocator<std::pair<xmrig::String_const,xmrig::CudaThreads>>>
      ::_M_insert_unique<std::pair<xmrig::String_const,xmrig::CudaThreads>>
                ((_Rb_tree<xmrig::String,std::pair<xmrig::String_const,xmrig::CudaThreads>,std::_Select1st<std::pair<xmrig::String_const,xmrig::CudaThreads>>,std::less<xmrig::String>,std::allocator<std::pair<xmrig::String_const,xmrig::CudaThreads>>>
                  *)this,&local_50);
      if (local_50.second.m_data.
          super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.second.m_data.
                        super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_50.first.m_data != (char *)0x0) {
        operator_delete__(local_50.first.m_data);
      }
    }
  }
  else {
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

inline size_t move(const char *profile, T &&threads)
    {
        if (has()) {
            return 0;
        }

        const size_t count = threads.count();

        if (!threads.isEmpty()) {
            m_profiles.insert({ profile, std::move(threads) });
        }

        return count;
    }